

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
::
insert<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
           *this,ArrayPtr<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
                 table,size_t pos,StringPtr *params)

{
  size_t *psVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  Vat *pVVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  uint uVar7;
  Vat *pVVar8;
  Entry *this_00;
  StringPtr *in_R9;
  HashBucket *_s944;
  Disposer *pDVar9;
  Disposer *pDVar10;
  Maybe<unsigned_long> MVar11;
  
  this_00 = table.ptr;
  if ((ulong)((long)(this_00->value).ptr * 2) < ((this_00->key).content.size_ + pos) * 3 + 3) {
    HashIndex<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
    ::rehash((HashIndex<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
              *)this_00,pos * 3 + 3);
  }
  uVar4 = hashCode<kj::ArrayPtr<unsigned_char_const>&>(in_R9);
  pVVar5 = (this_00->value).ptr;
  uVar7 = (int)pVVar5 - 1U & uVar4;
  pDVar9 = (Disposer *)0x0;
  aVar6 = extraout_RDX;
  do {
    pDVar10 = (this_00->value).disposer + uVar7;
    iVar2 = *(int *)((long)&pDVar10->_vptr_Disposer + 4);
    if (iVar2 == 1) {
      if (pDVar9 == (Disposer *)0x0) {
        pDVar9 = pDVar10;
      }
    }
    else {
      if (iVar2 == 0) {
        if (pDVar9 != (Disposer *)0x0) {
          psVar1 = &(this_00->key).content.size_;
          *psVar1 = *psVar1 - 1;
          pDVar10 = pDVar9;
        }
        pDVar10->_vptr_Disposer =
             (_func_int **)(((ulong)uVar4 | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
                 )0x0;
LAB_002d1383:
        MVar11.ptr.field_1.value = aVar6.value;
        MVar11.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar11.ptr;
      }
      if (*(uint *)&pDVar10->_vptr_Disposer == uVar4) {
        bVar3 = Array<unsigned_char>::operator==
                          ((Array<unsigned_char> *)((ulong)(iVar2 - 2) * 0x38 + table.size_),in_R9);
        aVar6 = extraout_RDX_00;
        if (bVar3) {
          iVar2 = *(int *)((long)&pDVar10->_vptr_Disposer + 4);
          *this = (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(iVar2 - 2);
          goto LAB_002d1383;
        }
        pVVar5 = (this_00->value).ptr;
      }
    }
    pVVar8 = (Vat *)((ulong)uVar7 + 1);
    uVar7 = (uint)pVVar8;
    if (pVVar8 == pVVar5) {
      uVar7 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }